

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dml.cpp
# Opt level: O2

record * __thiscall dml::searchRecord(dml *this,string *typeName,int32_t primaryKey)

{
  byte bVar1;
  ushort uVar2;
  iterator iVar3;
  int *piVar4;
  record *this_00;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  index iVar8;
  allocator local_311;
  page page;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  fstream searchFile;
  size_t __nbytes;
  
  iVar3 = SystemCatalog::getType(this->systemCatalog,typeName);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &(this->systemCatalog->types)._M_t._M_impl.super__Rb_tree_header) {
    iVar8 = SystemCatalog::searchKey(this->systemCatalog,(type *)(iVar3._M_node + 1),primaryKey);
    piVar4 = __errno_location();
    if (*piVar4 != -1) {
      std::__cxx11::string::string((string *)&local_290,"data/",&local_311);
      std::__cxx11::string::string((string *)&local_2d0,(string *)typeName);
      truncateName(&local_2b0,&local_2d0);
      std::operator+(&local_270,&local_290,&local_2b0);
      std::operator+(&local_250,&local_270,"_");
      std::__cxx11::to_string(&local_2f0,iVar8.file_id);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&page,
                     &local_250,&local_2f0);
      std::fstream::fstream(&searchFile,(string *)&page,_S_out|_S_in|_S_bin);
      std::__cxx11::string::~string((string *)&page);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_290);
      bVar1 = (char)iVar3._M_node[2]._M_color * '\x04';
      uVar2 = (ushort)(0x7fb / (bVar1 | 2));
      uVar5 = 0xff;
      if (uVar2 < 0xff) {
        uVar5 = uVar2;
      }
      __nbytes = (size_t)uVar5;
      ::page::page(&page,'\0',(uint)(byte)(bVar1 + 1),(uint8_t)uVar5);
      uVar7 = (uint)(iVar8._0_8_ >> 0x15) & 0x7f800;
      ::page::read(&page,(int)&searchFile,(void *)(ulong)(uVar7 + 0x16),__nbytes);
      this_00 = (record *)operator_new(0x18);
      record::record(this_00,'\0',(char)iVar3._M_node[2]._M_color);
      uVar6 = (page.slots[iVar8._0_8_ >> 0x28 & 0xff] - 1) * page.recordSize;
      record::read(this_00,(int)&searchFile,(void *)(ulong)(uVar6 + page.slotSize + uVar7 + 0x18),
                   (ulong)uVar6);
      ::page::~page(&page);
      std::fstream::~fstream(&searchFile);
      return this_00;
    }
  }
  return (record *)0x0;
}

Assistant:

record* dml::searchRecord(string typeName, int32_t primaryKey) {
    auto type = systemCatalog->getType(typeName);

    if(type == systemCatalog->types.end()) { return nullptr; }

    auto index = systemCatalog->searchKey(*type, primaryKey);

    if(errno == -1 ) {
        return nullptr ;
    }

    fstream searchFile(ROOT + truncateName(typeName) + INFIX + to_string(index.file_id), INOUTBIN);

    auto recordSize = (uint8_t) (RECORD_ID + type->numFields * FIELD);

    auto slotSize = (uint8_t) min((PAGE - PAGE_ID - NUM_RECORDS) / (recordSize+ 1), 255);

    page page(0, recordSize, slotSize);

    int offset = (IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE + LINK_TO_FILE) + (index.page_id * PAGE);

    page.read(searchFile, offset);

    auto record = new class record(0, type->numFields);

    record->read(searchFile, offset + (PAGE_ID + PAGE_NUM_RECORDS) + page.slotSize + page.recordSize * (page.slots[index.record_id] - 1));

    return record;
}